

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayKernel.cc
# Opt level: O0

void __thiscall OpenMesh::ArrayKernel::clean(ArrayKernel *this)

{
  vector<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_> local_58;
  vector<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_> local_40;
  vector<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_> local_28;
  ArrayKernel *local_10;
  ArrayKernel *this_local;
  
  local_10 = this;
  std::vector<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>::clear
            (&this->vertices_);
  memset(&local_28,0,0x18);
  std::vector<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>::vector
            (&local_28);
  std::vector<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>::swap
            (&local_28,&this->vertices_);
  std::vector<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>::~vector
            (&local_28);
  std::vector<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>::clear
            (&this->edges_);
  memset(&local_40,0,0x18);
  std::vector<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>::vector
            (&local_40);
  std::vector<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>::swap
            (&local_40,&this->edges_);
  std::vector<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>::~vector
            (&local_40);
  std::vector<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>::clear
            (&this->faces_);
  memset(&local_58,0,0x18);
  std::vector<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>::vector
            (&local_58);
  std::vector<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>::swap
            (&local_58,&this->faces_);
  std::vector<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>::~vector
            (&local_58);
  return;
}

Assistant:

void ArrayKernel::clean()
{

  vertices_.clear();
  VertexContainer().swap( vertices_ );

  edges_.clear();
  EdgeContainer().swap( edges_ );

  faces_.clear();
  FaceContainer().swap( faces_ );

}